

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smb.c
# Opt level: O1

CURLcode smb_setup_connection(connectdata *conn)

{
  Curl_easy *data;
  CURLcode CVar1;
  void *pvVar2;
  char *pcVar3;
  char *pcVar4;
  char *local_20;
  
  pvVar2 = (*Curl_ccalloc)(1,0x18);
  data = conn->data;
  (data->req).protop = pvVar2;
  if (pvVar2 != (void *)0x0) {
    CVar1 = Curl_urldecode(data,(data->state).up.path,0,&local_20,(size_t *)0x0,true);
    if (CVar1 != CURLE_OK) {
      return CVar1;
    }
    if ((*local_20 == '\\') || (pcVar4 = local_20, *local_20 == '/')) {
      pcVar4 = local_20 + 1;
    }
    pcVar4 = (*Curl_cstrdup)(pcVar4);
    (conn->proto).ftpc.pp.linestart_resp = pcVar4;
    (*Curl_cfree)(local_20);
    pcVar4 = (conn->proto).ftpc.pp.linestart_resp;
    if (pcVar4 != (char *)0x0) {
      pcVar3 = strchr(pcVar4,0x2f);
      if (pcVar3 == (char *)0x0) {
        pcVar3 = strchr(pcVar4,0x5c);
      }
      if (pcVar3 != (char *)0x0) {
        *pcVar3 = '\0';
        do {
          while( true ) {
            pcVar3 = pcVar3 + 1;
            if (*pcVar3 != '/') break;
            *pcVar3 = '\\';
          }
        } while (*pcVar3 != '\0');
        return CURLE_OK;
      }
      (*Curl_cfree)(pcVar4);
      (conn->proto).ftpc.pp.linestart_resp = (char *)0x0;
      return CURLE_URL_MALFORMAT;
    }
  }
  return CURLE_OUT_OF_MEMORY;
}

Assistant:

static CURLcode smb_setup_connection(struct connectdata *conn)
{
  struct smb_request *req;

  /* Initialize the request state */
  conn->data->req.protop = req = calloc(1, sizeof(struct smb_request));
  if(!req)
    return CURLE_OUT_OF_MEMORY;

  /* Parse the URL path */
  return smb_parse_url_path(conn);
}